

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evaluator.c
# Opt level: O2

Value * apply_check_bigger_equal_operation(Value *left_value,Value *right_value)

{
  long lVar1;
  longlong lVar2;
  longlong lVar3;
  Value *pVVar4;
  bool bVar5;
  longdouble lVar6;
  longdouble lVar7;
  
  if (left_value->value_type == ValueTypeIntegerValue) {
    if (right_value->value_type != ValueTypeIntegerValue) {
      if ((right_value->value_type & ~ValueTypeBoolValue) != ValueTypeIntegerValue)
      goto LAB_00107419;
      lVar7 = (longdouble)*(long *)(left_value + 1);
LAB_0010740b:
      lVar6 = *(longdouble *)&right_value[1].linked_variable_count;
LAB_0010740e:
      bVar5 = lVar6 <= lVar7;
      goto LAB_0010742f;
    }
    bVar5 = SBORROW8(*(long *)(left_value + 1),*(long *)(right_value + 1));
    lVar1 = *(long *)(left_value + 1) - *(long *)(right_value + 1);
  }
  else {
    if (((left_value->value_type & ~ValueTypeBoolValue) == ValueTypeIntegerValue) &&
       ((right_value->value_type & ~ValueTypeBoolValue) == ValueTypeIntegerValue)) {
      lVar7 = *(longdouble *)&left_value[1].linked_variable_count;
      if (right_value->value_type == ValueTypeFloatValue) goto LAB_0010740b;
      lVar6 = (longdouble)*(long *)(right_value + 1);
      goto LAB_0010740e;
    }
LAB_00107419:
    lVar2 = convert_to_integer(left_value);
    lVar3 = convert_to_integer(right_value);
    bVar5 = SBORROW8(lVar2,lVar3);
    lVar1 = lVar2 - lVar3;
  }
  bVar5 = bVar5 == lVar1 < 0;
LAB_0010742f:
  pVVar4 = new_bool_value(bVar5);
  return pVVar4;
}

Assistant:

Value *apply_check_bigger_equal_operation(Value *left_value, Value *right_value) {
  if (left_value->value_type == ValueTypeIntegerValue && right_value->value_type == ValueTypeIntegerValue) {
    return new_bool_value(((IntegerValue *) left_value)->integer_value >= ((IntegerValue *) right_value)->integer_value);
  }
  else if ((left_value->value_type == ValueTypeIntegerValue || left_value->value_type == ValueTypeFloatValue) && (right_value->value_type == ValueTypeIntegerValue || right_value->value_type == ValueTypeFloatValue)) {
    long double left_float, right_float;

    if (left_value->value_type == ValueTypeFloatValue) left_float = ((FloatValue *) left_value)->float_value;
    else left_float = ((IntegerValue *) left_value)->integer_value;

    if (right_value->value_type == ValueTypeFloatValue) right_float = ((FloatValue *) right_value)->float_value;
    else right_float = ((IntegerValue *) right_value)->integer_value;

    return new_bool_value(left_float >= right_float);
  }

  return new_bool_value(convert_to_integer(left_value) >= convert_to_integer(right_value));
}